

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O3

void __thiscall
rapic::client::add_filter
          (client *this,int station,string *product,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *moments)

{
  pointer pbVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ulong uVar3;
  long lVar4;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->state_ == disconnected) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RPFILTER:",9);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,station);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(product->_M_dataplus)._M_p,product->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":-1:-1",6);
    if ((moments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (moments->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 8;
      uVar3 = 0;
      do {
        local_1c8._M_dataplus._M_p._0_1_ = 0x2c;
        if (uVar3 == 0) {
          local_1c8._M_dataplus._M_p._0_1_ = 0x3a;
        }
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_1c8,1);
        pbVar1 = (moments->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,*(char **)((long)pbVar1 + lVar4 + -8),
                   *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar3 < (ulong)((long)(moments->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(moments->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->filters_,
               &local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1c8._M_dataplus._M_p._1_7_,local_1c8._M_dataplus._M_p._0_1_) !=
        &local_1c8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1c8._M_dataplus._M_p._1_7_,local_1c8._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"rapic: add_filter called while connected");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto client::add_filter(int station, std::string const& product, std::vector<std::string> const& moments) -> void
{
  if (state_ != rapic::connection_state::disconnected)
    throw std::runtime_error{"rapic: add_filter called while connected"};

  // RPFILTER
  // :station number (-1 = all)
  // :product type (ANY, PPI, RHI, COMPPPI, IMAGE, VOLUME, RHI_SET, MERGE, SCAN_ERROR)
  // :video format (-1 = whatever is available)
  // :data source (unused, always -1)
  // :moments to retrieve (ommitted for all available)
  std::ostringstream oss;
  oss << "RPFILTER:" << station << ":" << product << ":-1:-1";
  for (size_t i = 0; i < moments.size(); ++i)
    oss << (i == 0 ? ':' : ',') << moments[i];
  oss << "\n";
  filters_.emplace_back(oss.str());
}